

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

void duckdb::FindMinimalQualification
               (CatalogEntryRetriever *retriever,string *catalog_name,string *schema_name,
               bool *qualify_database,bool *qualify_schema)

{
  pointer pcVar1;
  size_t sVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pCVar6;
  pointer pCVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  pointer pCVar11;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_c8;
  string local_b0;
  string *local_90;
  string *local_88;
  CatalogEntryRetriever *local_80;
  bool *local_78;
  bool *local_70;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_68;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_48;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,anon_var_dwarf_63b5960 + 9);
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_c8,retriever,&local_b0,
                    schema_name);
  local_80 = retriever;
  local_78 = qualify_database;
  local_70 = qualify_schema;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pCVar7 = local_c8.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (catalog_name->_M_dataplus)._M_p;
    sVar2 = catalog_name->_M_string_length;
    pcVar3 = (schema_name->_M_dataplus)._M_p;
    sVar4 = schema_name->_M_string_length;
    bVar8 = false;
    pCVar6 = local_c8.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_90 = catalog_name;
    local_88 = schema_name;
    do {
      pCVar11 = pCVar6 + 1;
      sVar5 = (pCVar6->catalog)._M_string_length;
      if ((sVar5 == sVar2) &&
         ((((sVar5 == 0 ||
            (iVar9 = bcmp((pCVar6->catalog)._M_dataplus._M_p,pcVar1,sVar5), iVar9 == 0)) &&
           (sVar5 = (pCVar6->schema)._M_string_length, sVar5 == sVar4)) &&
          ((sVar5 == 0 || (iVar9 = bcmp((pCVar6->schema)._M_dataplus._M_p,pcVar3,sVar5), iVar9 == 0)
           ))))) {
        bVar10 = true;
        bVar8 = true;
      }
      else {
        bVar10 = false;
      }
    } while ((!bVar10) && (pCVar6 = pCVar11, pCVar11 != pCVar7));
    catalog_name = local_90;
    schema_name = local_88;
    if (bVar8) {
      bVar10 = true;
      bVar8 = false;
      goto LAB_00d4fa50;
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,anon_var_dwarf_63b5960 + 9);
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_68,local_80,catalog_name,
                    &local_b0);
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_48);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pCVar7 = local_c8.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (catalog_name->_M_dataplus)._M_p;
    sVar2 = catalog_name->_M_string_length;
    pcVar3 = (schema_name->_M_dataplus)._M_p;
    sVar4 = schema_name->_M_string_length;
    bVar8 = false;
    pCVar6 = local_c8.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pCVar11 = pCVar6 + 1;
      sVar5 = (pCVar6->catalog)._M_string_length;
      if (((sVar5 == sVar2) &&
          (((sVar5 == 0 ||
            (iVar9 = bcmp((pCVar6->catalog)._M_dataplus._M_p,pcVar1,sVar5), iVar9 == 0)) &&
           (sVar5 = (pCVar6->schema)._M_string_length, sVar5 == sVar4)))) &&
         ((sVar5 == 0 || (iVar9 = bcmp((pCVar6->schema)._M_dataplus._M_p,pcVar3,sVar5), iVar9 == 0))
         )) {
        bVar10 = true;
        bVar8 = true;
      }
      else {
        bVar10 = false;
      }
    } while ((!bVar10) && (pCVar6 = pCVar11, pCVar11 != pCVar7));
    if (bVar8) {
      bVar8 = true;
      bVar10 = false;
      goto LAB_00d4fa50;
    }
  }
  bVar8 = true;
  bVar10 = true;
LAB_00d4fa50:
  *local_78 = bVar8;
  *local_70 = bVar10;
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_c8);
  return;
}

Assistant:

void FindMinimalQualification(CatalogEntryRetriever &retriever, const string &catalog_name, const string &schema_name,
                              bool &qualify_database, bool &qualify_schema) {
	// check if we can we qualify ONLY the schema
	bool found = false;
	auto entries = GetCatalogEntries(retriever, INVALID_CATALOG, schema_name);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = false;
		qualify_schema = true;
		return;
	}
	// check if we can qualify ONLY the catalog
	found = false;
	entries = GetCatalogEntries(retriever, catalog_name, INVALID_SCHEMA);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = true;
		qualify_schema = false;
		return;
	}
	// need to qualify both catalog and schema
	qualify_database = true;
	qualify_schema = true;
}